

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::ByteSizeLong
          (CodeGeneratorResponse_File *this)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  size_t sVar2;
  size_t sVar3;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar3 = 0;
  }
  else {
    unknown_fields = CodeGeneratorResponse_File::unknown_fields(this);
    sVar3 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->name_).ptr_);
      sVar3 = sVar3 + sVar2 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->insertion_point_).ptr_);
      sVar3 = sVar3 + sVar2 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 4) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->content_).ptr_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t CodeGeneratorResponse_File::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 7u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string insertion_point = 2;
    if (has_insertion_point()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->insertion_point());
    }

    // optional string content = 15;
    if (has_content()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->content());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}